

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thanm.c
# Opt level: O0

void anm_extract(anm_archive_t *anm,char *name)

{
  long *plVar1;
  uchar *__ptr;
  uchar *temp_data;
  list_node_t *node;
  anm_entry_t *entry;
  uint y;
  uint f;
  image_t image;
  format_t formats [5];
  char *name_local;
  anm_archive_t *anm_local;
  
  image.format = FORMAT_GRAY8;
  image._20_4_ = 5;
  image.data._0_4_ = 0;
  image.data._4_4_ = 0;
  image.width = 0xffffffff;
  util_total_entry_size(anm,name,(uint *)&image,(uint *)((long)&image.data + 4));
  if (((int)image.data != 0) && (image.data._4_4_ != 0)) {
    _y = (uchar *)malloc((ulong)(uint)((int)image.data * image.data._4_4_ * 4));
    memset(_y,0xff,(ulong)(uint)((int)image.data * image.data._4_4_ * 4));
    for (entry._4_4_ = 0; entry._4_4_ < 5; entry._4_4_ = entry._4_4_ + 1) {
      for (temp_data = (uchar *)(anm->entries).head; temp_data != (uchar *)0x0;
          temp_data = *(uchar **)temp_data) {
        plVar1 = *(long **)(temp_data + 0x10);
        if (((*(short *)(*plVar1 + 0x34) != 0) && ((char *)plVar1[2] == name)) &&
           (formats[(ulong)entry._4_4_ - 2] == (uint)*(ushort *)(plVar1[1] + 6))) {
          __ptr = format_to_rgba((uchar *)plVar1[8],
                                 (uint)*(ushort *)(plVar1[1] + 8) *
                                 (uint)*(ushort *)(plVar1[1] + 10),(uint)*(ushort *)(plVar1[1] + 6))
          ;
          for (entry._0_4_ = *(uint *)(*plVar1 + 0x24);
              (uint)entry < *(int *)(*plVar1 + 0x24) + (uint)*(ushort *)(plVar1[1] + 10);
              entry._0_4_ = (uint)entry + 1) {
            memcpy(_y + (ulong)(uint)(*(int *)(*plVar1 + 0x20) << 2) +
                        (ulong)((uint)entry * (int)image.data * 4),
                   __ptr + ((uint)entry - *(int *)(*plVar1 + 0x24)) *
                           (uint)*(ushort *)(plVar1[1] + 8) * 4,
                   (long)(int)((uint)*(ushort *)(plVar1[1] + 8) << 2));
          }
          free(__ptr);
        }
      }
    }
    util_makepath(name);
    png_write(name,(image_t *)&y);
    free(_y);
  }
  return;
}

Assistant:

static void
anm_extract(
    const anm_archive_t* anm,
    const char* name)
{
    const format_t formats[] = {
        FORMAT_GRAY8,
        FORMAT_ARGB4444,
        FORMAT_RGB565,
        FORMAT_BGRA8888,
        FORMAT_RGBA8888
    };
    image_t image;

    unsigned int f, y;

    image.width = 0;
    image.height = 0;
    image.format = FORMAT_RGBA8888;

    util_total_entry_size(anm, name, &image.width, &image.height);

    if (image.width == 0 || image.height == 0) {
        /* Then there's nothing to extract. */
        return;
    }

    image.data = malloc(image.width * image.height * 4);
    /* XXX: Why 0xff? */
    memset(image.data, 0xff, image.width * image.height * 4);

    for (f = 0; f < sizeof(formats) / sizeof(formats[0]); ++f) {
        anm_entry_t* entry;
        list_for_each(&anm->entries, entry) {
            if (entry->header->hasdata && entry->name == name && formats[f] == entry->thtx->format) {
                unsigned char* temp_data = format_to_rgba(entry->data, entry->thtx->w * entry->thtx->h, entry->thtx->format);
                for (y = entry->header->y; y < entry->header->y + entry->thtx->h; ++y) {
                    memcpy(image.data + y * image.width * 4 + entry->header->x * 4,
                           temp_data + (y - entry->header->y) * entry->thtx->w * 4,
                           entry->thtx->w * 4);
                }
                free(temp_data);
            }
        }
    }

    util_makepath(name);
    png_write(name, &image);

    free(image.data);
}